

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::BlockThread
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,DWORD dwTimeout,bool fAlertable,
          bool fIsSleep,ThreadWakeupReason *ptwrWakeupReason,DWORD *pdwSignaledObject)

{
  ThreadWakeupReason TVar1;
  uint uVar2;
  PAL_ERROR PVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  ulong uVar7;
  int *piVar8;
  undefined7 in_register_00000009;
  char *pdwSignaledObject_00;
  undefined4 *extraout_RDX;
  DWORD dwTimeout_00;
  CPalThread *pCVar9;
  pthread_mutex_t *__mutex;
  undefined8 uVar10;
  ulong uVar11;
  char cVar12;
  uint uVar13;
  bool *pbVar14;
  bool bVar15;
  timespec tStack_98;
  DWORD *pDStack_88;
  undefined4 *puStack_80;
  uint *puStack_78;
  undefined8 uStack_70;
  ulong uStack_68;
  bool *pbStack_60;
  CPalThread *pCStack_58;
  undefined1 *puStack_50;
  ThreadWakeupReason *local_48;
  pthread_mutex_t *local_40;
  DWORD local_38;
  ThreadWakeupReason local_34;
  DWORD dwSigObjIdx;
  ThreadWakeupReason twrWakeupReason;
  
  pdwSignaledObject_00 = (char *)CONCAT71(in_register_00000009,fAlertable);
  pbVar14 = (bool *)((ulong)pdwSignaledObject_00 & 0xffffffff);
  local_34 = WaitFailed;
  local_38 = 0;
  __mutex = (pthread_mutex_t *)(pthrCurrent->synchronizationInfo).m_shridWaitAwakened;
  puStack_50 = (undefined1 *)0x1397f1;
  pCVar9 = pthrCurrent;
  local_48 = ptwrWakeupReason;
  local_40 = (pthread_mutex_t *)this;
  puVar6 = (uint *)SHMPtrToPtr((SHMPTR)__mutex);
  dwTimeout_00 = (DWORD)pCVar9;
  if (puVar6 == (uint *)0x0) {
    pdwSignaledObject_00 =
         "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
    ;
    puStack_50 = (undefined1 *)0x139825;
    fprintf((FILE *)&_stderr->__data,"] %s %s:%d","BlockThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xba);
    dwTimeout_00 = 0x170b8d;
    puStack_50 = (undefined1 *)0x139844;
    __mutex = _stderr;
    fprintf((FILE *)&_stderr->__data,
            "Expression: NULL != pdwWaitState, Description: Got NULL pdwWaitState from m_shridWaitAwakened=%p\n"
            ,(pthrCurrent->synchronizationInfo).m_shridWaitAwakened);
  }
  cVar12 = (char)pbVar14;
  if (fIsSleep) {
    if (cVar12 == '\0') {
      uVar7 = 0;
    }
    else {
      puStack_50 = (undefined1 *)0x139856;
      AcquireLocalSynchLock(pthrCurrent);
      puStack_50 = (undefined1 *)0x13985e;
      AcquireSharedSynchLock(pthrCurrent);
      puStack_50 = (undefined1 *)0x13986b;
      pCVar9 = pthrCurrent;
      __mutex = local_40;
      uVar7 = (**(code **)(local_40->__align + 0x18))();
      dwTimeout_00 = (DWORD)pCVar9;
      uVar7 = uVar7 & 0xffffffff;
    }
    if ((char)uVar7 != '\0') {
LAB_0013989f:
      if (cVar12 != '\0') {
        puStack_50 = (undefined1 *)0x1398ac;
        ReleaseSharedSynchLock(pthrCurrent);
        puStack_50 = (undefined1 *)0x1398b4;
        __mutex = (pthread_mutex_t *)pthrCurrent;
        ReleaseLocalSynchLock(pthrCurrent);
      }
      goto LAB_001398b4;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139b7f;
    pdwSignaledObject_00 = (char *)(ulong)(fAlertable + 1);
    LOCK();
    uVar2 = *puVar6;
    bVar15 = uVar2 == 0;
    if (bVar15) {
      *puVar6 = fAlertable + 1;
      uVar2 = 0;
    }
    UNLOCK();
    if (bVar15) goto LAB_0013989f;
    if (cVar12 != '\0') {
      puVar6 = (uint *)(ulong)uVar2;
      pbVar14 = &PAL_InitializeChakraCoreCalled;
      puStack_50 = (undefined1 *)0x1399bc;
      ReleaseSharedSynchLock(pthrCurrent);
      puStack_50 = (undefined1 *)0x1399c4;
      __mutex = (pthread_mutex_t *)pthrCurrent;
      ReleaseLocalSynchLock(pthrCurrent);
    }
    if (uVar2 == 3) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139b7f;
      uVar11 = 0xffffffff;
      uVar10 = CONCAT71((int7)(uVar7 >> 8),1);
    }
    else {
      puVar6 = (uint *)&stderr;
      pdwSignaledObject_00 =
           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
      ;
      uVar10 = 0;
      pbVar14 = (bool *)(ulong)uVar2;
      puStack_50 = (undefined1 *)0x139afc;
      fprintf((FILE *)&_stderr->__data,"] %s %s:%d","BlockThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0xfa);
      dwTimeout_00 = 0x170cca;
      puStack_50 = (undefined1 *)0x139b10;
      __mutex = _stderr;
      fprintf((FILE *)&_stderr->__data,"Unexpected thread wait state %u\n",pbVar14);
      uVar11 = 0x54f;
    }
  }
  else {
    uVar7 = 0;
LAB_001398b4:
    if ((char)uVar7 == '\0') {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139b7f;
      __mutex = (pthread_mutex_t *)&(pthrCurrent->synchronizationInfo).m_tnwdNativeData;
      pdwSignaledObject_00 = (char *)&local_38;
      puStack_50 = (undefined1 *)0x1398ee;
      dwTimeout_00 = dwTimeout;
      PVar3 = ThreadNativeWait((ThreadNativeWaitData *)&__mutex->__data,dwTimeout,&local_34,
                               (DWORD *)pdwSignaledObject_00);
      uVar11 = (ulong)PVar3;
      if (PVar3 != 0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139b7f;
        local_34 = WaitFailed;
        uVar10 = 0;
        goto LAB_00139b16;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139b7f;
    }
    else {
      local_34 = Alerted;
      uVar11 = 0;
    }
    if (local_34 != WaitTimeout) goto LAB_00139a05;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139b7f;
    uVar13 = fAlertable + 1;
    pdwSignaledObject_00 = (char *)0x0;
    LOCK();
    uVar2 = *puVar6;
    bVar15 = uVar13 == uVar2;
    if (bVar15) {
      *puVar6 = 0;
      uVar2 = uVar13;
    }
    UNLOCK();
    if (uVar2 == 3) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139b7f;
      uVar11 = 0xffffffff;
      uVar10 = 1;
    }
    else {
      if (uVar2 == 0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139b7f;
        __mutex = (pthread_mutex_t *)&(pthrCurrent->synchronizationInfo).m_tnwdNativeData;
        pdwSignaledObject_00 = (char *)&local_38;
        dwTimeout_00 = 0xffffffff;
        puStack_50 = (undefined1 *)0x139981;
        PVar3 = ThreadNativeWait((ThreadNativeWaitData *)&__mutex->__data,0xffffffff,&local_34,
                                 (DWORD *)pdwSignaledObject_00);
        uVar11 = (ulong)PVar3;
        if (PVar3 != 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139b7f;
          local_34 = WaitFailed;
        }
        if ((local_34 == WaitTimeout) && (PAL_InitializeChakraCoreCalled == false))
        goto LAB_00139b7f;
      }
      else if (!bVar15) {
        puStack_50 = (undefined1 *)0x139b59;
        fprintf((FILE *)&_stderr->__data,"] %s %s:%d","BlockThread",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0x164);
        dwTimeout_00 = 0x170bef;
        uVar10 = 0;
        pdwSignaledObject_00 = (char *)(ulong)uVar13;
        puStack_50 = (undefined1 *)0x139b7a;
        __mutex = _stderr;
        fprintf((FILE *)&_stderr->__data,
                "Expression: dwOldWaitState == dwWaitState, Description: Unexpected wait status: actual=%u, expected=%u\n"
                ,(ulong)uVar2);
        goto LAB_00139a08;
      }
LAB_00139a05:
      uVar10 = 0;
    }
LAB_00139a08:
    TVar1 = local_34;
    pbVar14 = (bool *)(ulong)local_34;
    if ((local_34 == WaitSucceeded) || (local_34 == MutexAbondoned)) {
      pdwSignaledObject_00 = (char *)(ulong)local_38;
      *pdwSignaledObject = local_38;
    }
    else if (local_34 == WaitTimeout) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139b7f;
      puStack_50 = (undefined1 *)0x139a35;
      AcquireLocalSynchLock(pthrCurrent);
      pdwSignaledObject_00 = (char *)0x0;
      puStack_50 = (undefined1 *)0x139a4a;
      pCVar9 = pthrCurrent;
      UnRegisterWait((CPalSynchronizationManager *)&local_40->__data,pthrCurrent,
                     &(pthrCurrent->synchronizationInfo).m_twiWaitInfo,false);
      dwTimeout_00 = (DWORD)pCVar9;
      puStack_50 = (undefined1 *)0x139a52;
      __mutex = (pthread_mutex_t *)pthrCurrent;
      ReleaseLocalSynchLock(pthrCurrent);
    }
    *local_48 = TVar1;
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_00139b7f:
      puStack_50 = (undefined1 *)0x139b84;
      abort();
    }
    if ((*puVar6 != 0) && (*puVar6 != 3)) {
      pbVar14 = (bool *)&stderr;
      pdwSignaledObject_00 =
           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
      ;
      puStack_50 = (undefined1 *)0x139ab5;
      fprintf((FILE *)&_stderr->__data,"] %s %s:%d","BlockThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0x193);
      dwTimeout_00 = 0x170c57;
      puStack_50 = (undefined1 *)0x139ac8;
      __mutex = _stderr;
      fprintf((FILE *)&_stderr->__data,
              "Expression: TWS_ACTIVE == VolatileLoad(pdwWaitState) || TWS_EARLYDEATH == VolatileLoad(pdwWaitState), Description: Unexpected thread wait state %u\n"
              ,(ulong)*puVar6);
    }
  }
LAB_00139b16:
  if ((char)uVar10 == '\0') {
    return (PAL_ERROR)uVar11;
  }
  puStack_50 = (undefined1 *)0x139b89;
  ThreadPrepareForShutdown();
  puStack_78 = puVar6;
  uStack_70 = uVar10;
  uStack_68 = uVar11;
  pbStack_60 = pbVar14;
  pCStack_58 = pthrCurrent;
  puStack_50 = &stack0xfffffffffffffff8;
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139d2d;
  pDStack_88 = (DWORD *)pdwSignaledObject_00;
  if (dwTimeout_00 == 0xffffffff) {
    PVar3 = 0;
    puStack_50 = &stack0xfffffffffffffff8;
LAB_00139bd9:
    iVar4 = pthread_mutex_lock(__mutex);
    if (iVar4 == 0) {
      puStack_80 = extraout_RDX;
      do {
        if (*(int *)((long)__mutex + 0x58) != 0) {
          iVar4 = 0;
          goto LAB_00139cc2;
        }
        if (dwTimeout_00 == 0xffffffff) {
          iVar4 = pthread_cond_wait((pthread_cond_t *)(__mutex + 1),__mutex);
        }
        else {
          iVar4 = pthread_cond_timedwait
                            ((pthread_cond_t *)(__mutex + 1),__mutex,(timespec *)&tStack_98);
        }
      } while (iVar4 == 0);
      if (iVar4 == 0x6e) {
        iVar4 = 0x6e;
        if (dwTimeout_00 == 0xffffffff) {
          fprintf((FILE *)&_stderr->__data,"] %s %s:%d","ThreadNativeWait",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                  ,0x1d2);
          fprintf((FILE *)&_stderr->__data,
                  "Expression: INFINITE != dwTimeout, Description: Got a ETIMEDOUT despite timeout was INFINITE\n"
                 );
        }
      }
      else {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139d2d;
        piVar8 = __errno_location();
        strerror(*piVar8);
        PVar3 = 0x54f;
      }
LAB_00139cc2:
      if (iVar4 == 0) {
        *(undefined4 *)((long)__mutex + 0x58) = 0;
      }
      iVar5 = pthread_mutex_unlock(__mutex);
      if (iVar5 != 0) {
        PVar3 = 0x54f;
        goto LAB_00139ce2;
      }
      if (iVar4 == 0) {
        *puStack_80 = *(undefined4 *)((long)__mutex + 0x60);
        *pDStack_88 = *(DWORD *)((long)__mutex + 0x5c);
      }
      else if (iVar4 == 0x6e) {
        *puStack_80 = 3;
      }
    }
    else {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139d2d;
      *extraout_RDX = 4;
      PVar3 = 0x54f;
    }
  }
  else {
    puStack_50 = &stack0xfffffffffffffff8;
    PVar3 = GetAbsoluteTimeout(dwTimeout_00,&tStack_98);
    if (PVar3 == 0) goto LAB_00139bd9;
LAB_00139ce2:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00139d2d;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar3;
  }
LAB_00139d2d:
  abort();
}

Assistant:

PAL_ERROR CPalSynchronizationManager::BlockThread(
        CPalThread *pthrCurrent,
        DWORD dwTimeout,
        bool fAlertable,
        bool fIsSleep,
        ThreadWakeupReason *ptwrWakeupReason,
        DWORD * pdwSignaledObject)
    {
        PAL_ERROR palErr = NO_ERROR;
        ThreadWakeupReason twrWakeupReason = WaitFailed;
        DWORD * pdwWaitState;
        DWORD dwWaitState = 0;
        DWORD dwSigObjIdx = 0;
        bool fRaceAlerted = false;
        bool fEarlyDeath = false;

        pdwWaitState = SharedIDToTypePointer(DWORD,
                pthrCurrent->synchronizationInfo.m_shridWaitAwakened);

        _ASSERT_MSG(NULL != pdwWaitState,
                    "Got NULL pdwWaitState from m_shridWaitAwakened=%p\n",
                    (VOID *)pthrCurrent->synchronizationInfo.m_shridWaitAwakened);

        if (fIsSleep)
        {
            // If fIsSleep is true we are being called by Sleep/SleepEx
            // and we need to switch the wait state to TWS_WAITING or
            // TWS_ALERTABLE (according to fAlertable)

            if (fAlertable)
            {
                // If we are in alertable mode we need to grab the lock to
                // make sure that no APC is queued right before the
                // InterlockedCompareExchange.
                // If there are APCs queued at this time, no native wakeup
                // will be posted, so we need to skip the native wait

                // Lock
                AcquireLocalSynchLock(pthrCurrent);
                AcquireSharedSynchLock(pthrCurrent);

                if (AreAPCsPending(pthrCurrent))
                {
                    // APCs have been queued when the thread wait status was
                    // still TWS_ACTIVE, therefore the queueing thread will not
                    // post any native wakeup: we need to skip the actual
                    // native wait
                    fRaceAlerted = true;
                }
            }

            if (!fRaceAlerted)
            {
                // Setting the thread in wait state
                dwWaitState = (DWORD)(fAlertable ? TWS_ALERTABLE : TWS_WAITING);

                TRACE("Switching my wait state [%p] from TWS_ACTIVE to %u "
                      "[current *pdwWaitState=%u]\n",
                      pdwWaitState, dwWaitState, *pdwWaitState);

                dwWaitState = InterlockedCompareExchange((LONG *)pdwWaitState,
                                                         dwWaitState,
                                                         TWS_ACTIVE);

                if((DWORD)TWS_ACTIVE != dwWaitState)
                {
                    if (fAlertable)
                    {
                        // Unlock
                        ReleaseSharedSynchLock(pthrCurrent);
                        ReleaseLocalSynchLock(pthrCurrent);
                    }
                    if((DWORD)TWS_EARLYDEATH == dwWaitState)
                    {
                        // Process is terminating, this thread will soon be
                        // suspended (by SuspendOtherThreads).
                        WARN("Thread is about to get suspended by "
                             "TerminateProcess\n");

                        fEarlyDeath = true;
                        palErr = WAIT_FAILED;
                    }
                    else
                    {
                        ASSERT("Unexpected thread wait state %u\n",
                               dwWaitState);
                        palErr = ERROR_INTERNAL_ERROR;
                    }
                    goto BT_exit;
                }
            }

            if (fAlertable)
            {
                // Unlock
                ReleaseSharedSynchLock(pthrCurrent);
                ReleaseLocalSynchLock(pthrCurrent);
            }
        }

        if (fRaceAlerted)
        {
            twrWakeupReason = Alerted;
        }
        else
        {
            TRACE("Current thread is about to block for waiting\n");

            palErr = ThreadNativeWait(
                &pthrCurrent->synchronizationInfo.m_tnwdNativeData,
                dwTimeout,
                &twrWakeupReason,
                &dwSigObjIdx);

            if (NO_ERROR != palErr)
            {
                ERROR("ThreadNativeWait() failed [palErr=%d]\n", palErr);
                twrWakeupReason = WaitFailed;
                goto BT_exit;
            }

            TRACE("ThreadNativeWait returned {WakeupReason=%u "
                  "dwSigObjIdx=%u}\n", twrWakeupReason, dwSigObjIdx);
        }

        if (WaitTimeout == twrWakeupReason)
        {
            // timeout reached. set wait state back to 'active'
            dwWaitState = (DWORD)(fAlertable ? TWS_ALERTABLE : TWS_WAITING);

            TRACE("Current thread awakened for timeout: switching wait "
                  "state [%p] from %u to TWS_ACTIVE [current *pdwWaitState=%u]\n",
                   pdwWaitState, dwWaitState, *pdwWaitState);

            DWORD dwOldWaitState = InterlockedCompareExchange(
                                        (LONG *)pdwWaitState,
                                        TWS_ACTIVE, (LONG)dwWaitState);

            switch (dwOldWaitState)
            {
                case TWS_ACTIVE:
                    // We were already ACTIVE; someone decided to wake up this
                    // thread sometime between the moment the native wait
                    // timed out and here. Since the signaling side succeeded
                    // its InterlockedCompareExchange, it will signal the
                    // condition/predicate pair (we just raced overtaking it);
                    // therefore we need to clear the condition/predicate
                    // by waiting on it one more time.
                    // That will also cause this method to report a signal
                    // rather than a timeout.
                    // In the remote signaling scenario, this second wait
                    // also makes sure that the shared id passed over the
                    // process pipe is valid for the entire duration of time
                    // in which the worker thread deals with it
                    TRACE("Current thread already ACTIVE: a signaling raced "
                          "with the timeout: re-waiting natively to clear the "
                          "predicate\n");

                    palErr = ThreadNativeWait(
                        &pthrCurrent->synchronizationInfo.m_tnwdNativeData,
                        SecondNativeWaitTimeout,
                        &twrWakeupReason,
                        &dwSigObjIdx);

                    if (NO_ERROR != palErr)
                    {
                        ERROR("ThreadNativeWait() failed [palErr=%d]\n",
                              palErr);
                        twrWakeupReason = WaitFailed;
                    }
                    if (WaitTimeout == twrWakeupReason)
                    {
                        ERROR("Second native wait timed out\n");
                    }
                    break;
                case TWS_EARLYDEATH:
                    // Thread is about to be suspended by TerminateProcess.
                    // Anyway, if the wait timed out, we still want to
                    // (try to) unregister the wait (especially if it
                    // involves shared objects)
                    WARN("Thread is about to be suspended by "
                         "TerminateProcess\n");
                    fEarlyDeath = true;
                    palErr = WAIT_FAILED;
                    break;
                case TWS_WAITING:
                case TWS_ALERTABLE:
                default:
                    _ASSERT_MSG(dwOldWaitState == dwWaitState,
                                "Unexpected wait status: actual=%u, "
                                "expected=%u\n",
                               dwOldWaitState, dwWaitState);
                    break;
            }
        }

        switch (twrWakeupReason)
        {
            case WaitTimeout:
            {
                // Awakened for timeout: we need to unregister the wait
                ThreadWaitInfo * ptwiWaitInfo;

                TRACE("Current thread awakened for timeout: "
                            "unregistering the wait\n");

                // Local lock
                AcquireLocalSynchLock(pthrCurrent);

                ptwiWaitInfo = GetThreadWaitInfo(pthrCurrent);

                // Unregister the wait
                // Note: UnRegisterWait will take care of grabbing the shared
                //       synch lock, if needed.
                UnRegisterWait(pthrCurrent, ptwiWaitInfo, false);

                // Unlock
                ReleaseLocalSynchLock(pthrCurrent);

                break;
            }
            case WaitSucceeded:
            case MutexAbondoned:
                *pdwSignaledObject = dwSigObjIdx;
                break;
            default:
                // 'Alerted' and 'WaitFailed' go through this case
                break;
        }

        // Set the returned wakeup reason
        *ptwrWakeupReason = twrWakeupReason;

        TRACE("Current thread is now active [WakeupReason=%u SigObjIdx=%u]\n",
              twrWakeupReason, dwSigObjIdx);

        _ASSERT_MSG(TWS_ACTIVE == VolatileLoad(pdwWaitState) ||
                    TWS_EARLYDEATH == VolatileLoad(pdwWaitState),
                    "Unexpected thread wait state %u\n", VolatileLoad(pdwWaitState));

    BT_exit:
        if (fEarlyDeath)
        {
            ThreadPrepareForShutdown();
        }
        return palErr;
    }